

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall BoardView::ThemeSetStyle(BoardView *this,char *name)

{
  int iVar1;
  ImGuiStyle *pIVar2;
  
  pIVar2 = ImGui::GetStyle();
  pIVar2->WindowBorderSize = 0.0;
  iVar1 = strcmp(name,"dark");
  if (iVar1 == 0) {
    *(undefined8 *)pIVar2->Colors = 0x3f6666663f666666;
    pIVar2->Colors[0].z = 0.9;
    pIVar2->Colors[0].w = 1.0;
    pIVar2->Colors[1].x = 0.6;
    pIVar2->Colors[1].y = 0.6;
    pIVar2->Colors[1].z = 0.6;
    pIVar2->Colors[1].w = 1.0;
    pIVar2->Colors[2].x = 0.0;
    pIVar2->Colors[2].y = 0.0;
    pIVar2->Colors[2].z = 0.0;
    pIVar2->Colors[2].w = 0.7;
    pIVar2->Colors[3].x = 0.0;
    pIVar2->Colors[3].y = 0.0;
    pIVar2->Colors[3].z = 0.0;
    pIVar2->Colors[3].w = 0.0;
    pIVar2->Colors[4].x = 0.05;
    pIVar2->Colors[4].y = 0.05;
    pIVar2->Colors[4].z = 0.1;
    pIVar2->Colors[4].w = 0.9;
    pIVar2->Colors[5].x = 0.7;
    pIVar2->Colors[5].y = 0.7;
    pIVar2->Colors[5].z = 0.7;
    pIVar2->Colors[5].w = 0.65;
    pIVar2->Colors[6].x = 0.0;
    pIVar2->Colors[6].y = 0.0;
    pIVar2->Colors[6].z = 0.0;
    pIVar2->Colors[6].w = 0.0;
    pIVar2->Colors[7].x = 0.3;
    pIVar2->Colors[7].y = 0.3;
    pIVar2->Colors[7].z = 0.3;
    pIVar2->Colors[7].w = 1.0;
    pIVar2->Colors[8].x = 0.9;
    pIVar2->Colors[8].y = 0.8;
    pIVar2->Colors[8].z = 0.8;
    pIVar2->Colors[8].w = 0.4;
    pIVar2->Colors[9].x = 0.9;
    pIVar2->Colors[9].y = 0.65;
    pIVar2->Colors[9].z = 0.65;
    pIVar2->Colors[9].w = 0.45;
    pIVar2->Colors[10].x = 0.27;
    pIVar2->Colors[10].y = 0.27;
    pIVar2->Colors[10].z = 0.54;
    pIVar2->Colors[10].w = 0.83;
    pIVar2->Colors[0xc].x = 0.4;
    pIVar2->Colors[0xc].y = 0.4;
    pIVar2->Colors[0xc].z = 0.8;
    pIVar2->Colors[0xc].w = 0.2;
    pIVar2->Colors[0xb].x = 0.32;
    pIVar2->Colors[0xb].y = 0.32;
    pIVar2->Colors[0xb].z = 0.63;
    pIVar2->Colors[0xb].w = 0.87;
    pIVar2->Colors[0xd].x = 0.4;
    pIVar2->Colors[0xd].y = 0.4;
    pIVar2->Colors[0xd].z = 0.55;
    pIVar2->Colors[0xd].w = 0.8;
    pIVar2->Colors[0xe].x = 0.2;
    pIVar2->Colors[0xe].y = 0.25;
    pIVar2->Colors[0xe].z = 0.3;
    pIVar2->Colors[0xe].w = 0.6;
    pIVar2->Colors[0xf].x = 0.4;
    pIVar2->Colors[0xf].y = 0.4;
    pIVar2->Colors[0xf].z = 0.8;
    pIVar2->Colors[0xf].w = 0.3;
    pIVar2->Colors[0x10].x = 0.4;
    pIVar2->Colors[0x10].y = 0.4;
    pIVar2->Colors[0x10].z = 0.8;
    pIVar2->Colors[0x10].w = 0.4;
    pIVar2->Colors[0x11].x = 0.8;
    pIVar2->Colors[0x11].y = 0.5;
    pIVar2->Colors[0x11].z = 0.5;
    pIVar2->Colors[0x11].w = 0.4;
    *(undefined8 *)(pIVar2->Colors + 0x12) = 0x3f6666663f666666;
    pIVar2->Colors[0x12].z = 0.9;
    pIVar2->Colors[0x12].w = 0.5;
    pIVar2->Colors[0x13].x = 1.0;
    pIVar2->Colors[0x13].y = 1.0;
    pIVar2->Colors[0x13].z = 1.0;
    pIVar2->Colors[0x13].w = 0.3;
    pIVar2->Colors[0x14].x = 0.8;
    pIVar2->Colors[0x14].y = 0.5;
    pIVar2->Colors[0x14].z = 0.5;
    pIVar2->Colors[0x14].w = 1.0;
    pIVar2->Colors[0x15].x = 0.67;
    pIVar2->Colors[0x15].y = 0.4;
    pIVar2->Colors[0x15].z = 0.4;
    pIVar2->Colors[0x15].w = 0.6;
    pIVar2->Colors[0x16].x = 0.67;
    pIVar2->Colors[0x16].y = 0.4;
    pIVar2->Colors[0x16].z = 0.4;
    pIVar2->Colors[0x16].w = 1.0;
    pIVar2->Colors[0x17].x = 0.8;
    pIVar2->Colors[0x17].y = 0.5;
    pIVar2->Colors[0x17].z = 0.5;
    pIVar2->Colors[0x17].w = 1.0;
    pIVar2->Colors[0x18].x = 0.4;
    pIVar2->Colors[0x18].y = 0.4;
    pIVar2->Colors[0x18].z = 0.9;
    pIVar2->Colors[0x18].w = 0.45;
    pIVar2->Colors[0x19].x = 0.45;
    pIVar2->Colors[0x19].y = 0.45;
    pIVar2->Colors[0x19].z = 0.9;
    pIVar2->Colors[0x19].w = 0.8;
    pIVar2->Colors[0x1a].x = 0.53;
    pIVar2->Colors[0x1a].y = 0.53;
    pIVar2->Colors[0x1a].z = 0.87;
    pIVar2->Colors[0x1a].w = 0.8;
    pIVar2->Colors[0x1b].x = 0.5;
    pIVar2->Colors[0x1b].y = 0.5;
    pIVar2->Colors[0x1b].z = 0.5;
    pIVar2->Colors[0x1b].w = 1.0;
    pIVar2->Colors[0x1c].x = 0.7;
    pIVar2->Colors[0x1c].y = 0.6;
    pIVar2->Colors[0x1c].z = 0.6;
    pIVar2->Colors[0x1c].w = 1.0;
    *(undefined8 *)(pIVar2->Colors + 0x1d) = 0x3f3333333f666666;
    pIVar2->Colors[0x1d].z = 0.7;
    pIVar2->Colors[0x1d].w = 1.0;
    pIVar2->Colors[0x1e].x = 1.0;
    pIVar2->Colors[0x1e].y = 1.0;
    pIVar2->Colors[0x1e].z = 1.0;
    pIVar2->Colors[0x1e].w = 0.3;
    pIVar2->Colors[0x1f].x = 1.0;
    pIVar2->Colors[0x1f].y = 1.0;
    pIVar2->Colors[0x1f].z = 1.0;
    pIVar2->Colors[0x1f].w = 0.6;
    pIVar2->Colors[0x20].x = 1.0;
    pIVar2->Colors[0x20].y = 1.0;
    pIVar2->Colors[0x20].z = 1.0;
    pIVar2->Colors[0x20].w = 0.9;
    pIVar2->Colors[0x26].x = 1.0;
    pIVar2->Colors[0x26].y = 1.0;
    pIVar2->Colors[0x26].z = 1.0;
    pIVar2->Colors[0x26].w = 1.0;
    *(undefined8 *)(pIVar2->Colors + 0x27) = 0x3f3333333f666666;
    pIVar2->Colors[0x27].z = 0.0;
    pIVar2->Colors[0x27].w = 1.0;
    *(undefined8 *)(pIVar2->Colors + 0x28) = 0x3f3333333f666666;
    pIVar2->Colors[0x28].z = 0.0;
    pIVar2->Colors[0x28].w = 1.0;
    pIVar2->Colors[0x29].x = 1.0;
    pIVar2->Colors[0x29].y = 0.6;
    pIVar2->Colors[0x29].z = 0.0;
    pIVar2->Colors[0x29].w = 1.0;
    pIVar2->Colors[0x2f].x = 0.0;
    pIVar2->Colors[0x2f].y = 0.0;
    pIVar2->Colors[0x2f].z = 1.0;
    pIVar2->Colors[0x2f].w = 0.35;
    pIVar2->Colors[0x34].x = 0.2;
    pIVar2->Colors[0x34].y = 0.2;
    pIVar2->Colors[0x34].z = 0.2;
    pIVar2->Colors[0x34].w = 0.35;
    pIVar2->Colors[0x2d].x = 0.05;
    pIVar2->Colors[0x2d].y = 0.05;
    pIVar2->Colors[0x2d].z = 0.1;
    pIVar2->Colors[0x2d].w = 0.9;
    pIVar2->Colors[0x2e].x = 0.1;
    pIVar2->Colors[0x2e].y = 0.1;
    pIVar2->Colors[0x2e].z = 0.2;
    pIVar2->Colors[0x2e].w = 0.9;
    (this->m_colors).backgroundColor = 0xff000000;
    (this->m_colors).boardFillColor = 0xff2a2a2a;
    (this->m_colors).partOutlineColor = 0xff999999;
    (this->m_colors).partHullColor = 0x80808080;
    (this->m_colors).partFillColor = 0xff111111;
    (this->m_colors).partHighlightedColor = 0xffffffff;
    (this->m_colors).partHighlightedFillColor = 0xff333333;
    (this->m_colors).boardOutlineColor = 0xff2222cc;
    (this->m_colors).partTextColor = 0xff000000;
    (this->m_colors).partTextBackgroundColor = 0xff22cccc;
    (this->m_colors).pinDefaultColor = 0xffff4040;
    (this->m_colors).pinDefaultTextColor = 0xffcccccc;
    (this->m_colors).pinGroundColor = 0xffc30003;
    (this->m_colors).pinNotConnectedColor = 0xffaaaaaa;
    (this->m_colors).pinTestPadColor = 0xff888888;
    (this->m_colors).pinTestPadFillColor = 0xff1f5b6c;
    (this->m_colors).pinA1PadColor = 0xff0000dd;
    (this->m_colors).pinSelectedColor = 0xff00ff00;
    (this->m_colors).pinSelectedFillColor = 0xffff8888;
    (this->m_colors).pinSelectedTextColor = 0xffffffff;
    (this->m_colors).pinSameNetColor = 0xffff0000;
    (this->m_colors).pinSameNetFillColor = 0xffff9999;
    (this->m_colors).pinSameNetTextColor = 0xff111111;
    (this->m_colors).pinHaloColor = 0x88ffffff;
    (this->m_colors).pinNetWebColor = 0x888888ff;
    (this->m_colors).pinNetWebOSColor = 0x88ff8888;
    (this->m_colors).annotationPartAliasColor = 0xff00ffff;
    (this->m_colors).annotationBoxColor = 0xff88cccc;
    (this->m_colors).annotationStalkColor = 0xffaaaaaa;
    (this->m_colors).annotationPopupBackgroundColor = 0xff888888;
    (this->m_colors).annotationPopupTextColor = 0xffffffff;
    (this->m_colors).selectedMaskPins = 0xffffffff;
    (this->m_colors).selectedMaskParts = 0xffffffff;
    (this->m_colors).selectedMaskOutline = 0xffffffff;
  }
  else {
    pIVar2->Colors[0].x = 0.0;
    pIVar2->Colors[0].y = 0.0;
    pIVar2->Colors[0].z = 0.0;
    pIVar2->Colors[0].w = 1.0;
    pIVar2->Colors[1].x = 0.6;
    pIVar2->Colors[1].y = 0.6;
    pIVar2->Colors[1].z = 0.6;
    pIVar2->Colors[1].w = 1.0;
    pIVar2->Colors[4].x = 0.94;
    pIVar2->Colors[4].y = 0.94;
    pIVar2->Colors[4].z = 0.94;
    pIVar2->Colors[4].w = 1.0;
    pIVar2->Colors[2].x = 0.94;
    pIVar2->Colors[2].y = 0.94;
    pIVar2->Colors[2].z = 0.94;
    pIVar2->Colors[2].w = 1.0;
    pIVar2->Colors[5].x = 0.0;
    pIVar2->Colors[5].y = 0.0;
    pIVar2->Colors[5].z = 0.0;
    pIVar2->Colors[3].x = 0.0;
    pIVar2->Colors[3].y = 0.0;
    pIVar2->Colors[3].z = 0.0;
    pIVar2->Colors[3].w = 0.0;
    *(undefined8 *)&pIVar2->Colors[5].w = 0x3f8000003ec7ae14;
    pIVar2->Colors[6].y = 1.0;
    pIVar2->Colors[6].z = 1.0;
    *(undefined8 *)&pIVar2->Colors[6].w = 0x3f8000003dcccccd;
    pIVar2->Colors[7].y = 1.0;
    pIVar2->Colors[7].z = 1.0;
    *(undefined8 *)&pIVar2->Colors[7].w = 0x3e851eb83f800000;
    pIVar2->Colors[8].y = 0.59;
    pIVar2->Colors[8].z = 0.98;
    *(undefined8 *)&pIVar2->Colors[8].w = 0x3e851eb83ecccccd;
    pIVar2->Colors[9].y = 0.59;
    pIVar2->Colors[9].z = 0.98;
    *(undefined8 *)&pIVar2->Colors[9].w = 0x3f75c28f3f2b851f;
    pIVar2->Colors[10].y = 0.96;
    pIVar2->Colors[10].z = 0.96;
    pIVar2->Colors[10].w = 1.0;
    pIVar2->Colors[0xc].x = 1.0;
    pIVar2->Colors[0xc].y = 1.0;
    pIVar2->Colors[0xc].z = 1.0;
    pIVar2->Colors[0xc].w = 0.51;
    pIVar2->Colors[0xb].x = 0.82;
    pIVar2->Colors[0xb].y = 0.82;
    pIVar2->Colors[0xb].z = 0.82;
    pIVar2->Colors[0xb].w = 1.0;
    pIVar2->Colors[0xd].x = 0.82;
    pIVar2->Colors[0xd].y = 0.82;
    pIVar2->Colors[0xd].z = 0.82;
    pIVar2->Colors[0xd].w = 1.0;
    pIVar2->Colors[0xe].x = 0.98;
    pIVar2->Colors[0xe].y = 0.98;
    pIVar2->Colors[0xe].z = 0.98;
    pIVar2->Colors[0xe].w = 0.53;
    pIVar2->Colors[0xf].x = 0.69;
    pIVar2->Colors[0xf].y = 0.69;
    pIVar2->Colors[0xf].z = 0.69;
    pIVar2->Colors[0xf].w = 0.8;
    pIVar2->Colors[0x10].x = 0.49;
    pIVar2->Colors[0x10].y = 0.49;
    pIVar2->Colors[0x10].z = 0.49;
    pIVar2->Colors[0x10].w = 0.8;
    pIVar2->Colors[0x11].x = 0.49;
    pIVar2->Colors[0x11].y = 0.49;
    pIVar2->Colors[0x11].z = 0.49;
    pIVar2->Colors[0x11].w = 1.0;
    pIVar2->Colors[0x12].x = 0.26;
    pIVar2->Colors[0x12].y = 0.59;
    pIVar2->Colors[0x12].z = 0.98;
    pIVar2->Colors[0x12].w = 1.0;
    pIVar2->Colors[0x13].x = 0.26;
    pIVar2->Colors[0x13].y = 0.59;
    pIVar2->Colors[0x13].z = 0.98;
    pIVar2->Colors[0x13].w = 0.78;
    pIVar2->Colors[0x14].x = 0.26;
    pIVar2->Colors[0x14].y = 0.59;
    pIVar2->Colors[0x14].z = 0.98;
    pIVar2->Colors[0x14].w = 1.0;
    pIVar2->Colors[0x15].x = 0.26;
    pIVar2->Colors[0x15].y = 0.59;
    pIVar2->Colors[0x15].z = 0.98;
    pIVar2->Colors[0x15].w = 0.4;
    pIVar2->Colors[0x16].x = 0.26;
    pIVar2->Colors[0x16].y = 0.59;
    pIVar2->Colors[0x16].z = 0.98;
    pIVar2->Colors[0x16].w = 1.0;
    pIVar2->Colors[0x17].x = 0.06;
    pIVar2->Colors[0x17].y = 0.53;
    pIVar2->Colors[0x17].z = 0.98;
    pIVar2->Colors[0x17].w = 1.0;
    pIVar2->Colors[0x18].x = 0.26;
    pIVar2->Colors[0x18].y = 0.59;
    pIVar2->Colors[0x18].z = 0.98;
    pIVar2->Colors[0x18].w = 0.31;
    pIVar2->Colors[0x19].x = 0.26;
    pIVar2->Colors[0x19].y = 0.59;
    pIVar2->Colors[0x19].z = 0.98;
    pIVar2->Colors[0x19].w = 0.8;
    pIVar2->Colors[0x1a].x = 0.26;
    pIVar2->Colors[0x1a].y = 0.59;
    pIVar2->Colors[0x1a].z = 0.98;
    pIVar2->Colors[0x1a].w = 1.0;
    pIVar2->Colors[0x1b].x = 0.39;
    pIVar2->Colors[0x1b].y = 0.39;
    pIVar2->Colors[0x1b].z = 0.39;
    pIVar2->Colors[0x1b].w = 1.0;
    pIVar2->Colors[0x1c].x = 0.26;
    pIVar2->Colors[0x1c].y = 0.59;
    pIVar2->Colors[0x1c].z = 0.98;
    pIVar2->Colors[0x1c].w = 0.78;
    pIVar2->Colors[0x1d].x = 0.26;
    pIVar2->Colors[0x1d].y = 0.59;
    pIVar2->Colors[0x1d].z = 0.98;
    pIVar2->Colors[0x1d].w = 1.0;
    pIVar2->Colors[0x1e].x = 1.0;
    pIVar2->Colors[0x1e].y = 1.0;
    pIVar2->Colors[0x1e].z = 1.0;
    pIVar2->Colors[0x1e].w = 0.0;
    pIVar2->Colors[0x1f].x = 0.26;
    pIVar2->Colors[0x1f].y = 0.59;
    pIVar2->Colors[0x1f].z = 0.98;
    pIVar2->Colors[0x1f].w = 0.67;
    pIVar2->Colors[0x20].x = 0.26;
    pIVar2->Colors[0x20].y = 0.59;
    pIVar2->Colors[0x20].z = 0.98;
    pIVar2->Colors[0x20].w = 0.95;
    pIVar2->Colors[0x26].x = 0.39;
    pIVar2->Colors[0x26].y = 0.39;
    pIVar2->Colors[0x26].z = 0.39;
    pIVar2->Colors[0x26].w = 1.0;
    pIVar2->Colors[0x27].x = 1.0;
    pIVar2->Colors[0x27].y = 0.43;
    pIVar2->Colors[0x27].z = 0.35;
    pIVar2->Colors[0x27].w = 1.0;
    *(undefined8 *)(pIVar2->Colors + 0x28) = 0x3f3333333f666666;
    pIVar2->Colors[0x28].z = 0.0;
    pIVar2->Colors[0x28].w = 1.0;
    pIVar2->Colors[0x29].x = 1.0;
    pIVar2->Colors[0x29].y = 0.6;
    pIVar2->Colors[0x29].z = 0.0;
    pIVar2->Colors[0x29].w = 1.0;
    pIVar2->Colors[0x2f].x = 0.26;
    pIVar2->Colors[0x2f].y = 0.59;
    pIVar2->Colors[0x2f].z = 0.98;
    pIVar2->Colors[0x2f].w = 0.35;
    pIVar2->Colors[0x34].x = 0.2;
    pIVar2->Colors[0x34].y = 0.2;
    pIVar2->Colors[0x34].z = 0.2;
    pIVar2->Colors[0x34].w = 0.35;
    pIVar2->Colors[0x2d].x = 0.94;
    pIVar2->Colors[0x2d].y = 0.94;
    pIVar2->Colors[0x2d].z = 0.94;
    pIVar2->Colors[0x2d].w = 1.0;
    pIVar2->Colors[0x2e].x = 0.82;
    pIVar2->Colors[0x2e].y = 0.82;
    pIVar2->Colors[0x2e].z = 0.82;
    pIVar2->Colors[0x2e].w = 1.0;
    (this->m_colors).backgroundColor = 0xffffffff;
    (this->m_colors).boardFillColor = 0xffdddddd;
    (this->m_colors).partOutlineColor = 0xff444444;
    (this->m_colors).partHullColor = 0x80808080;
    (this->m_colors).partFillColor = 0x77ffffff;
    (this->m_colors).partHighlightedColor = 0xff0000ff;
    (this->m_colors).partHighlightedFillColor = 0xfff0f0f0;
    (this->m_colors).partTextColor = 0xff3030ff;
    (this->m_colors).partTextBackgroundColor = 0xff00ffff;
    (this->m_colors).boardOutlineColor = 0xff444444;
    (this->m_colors).pinDefaultColor = 0xff33aa22;
    (this->m_colors).pinDefaultTextColor = 0xff886666;
    (this->m_colors).pinGroundColor = 0xffaa2222;
    (this->m_colors).pinNotConnectedColor = 0xffaaaaaa;
    (this->m_colors).pinTestPadColor = 0xff888888;
    (this->m_colors).pinTestPadFillColor = 0xff8dc6d6;
    (this->m_colors).pinA1PadColor = 0xff0000dd;
    (this->m_colors).pinSelectedColor = 0;
    (this->m_colors).pinSelectedFillColor = 0xffff8888;
    (this->m_colors).pinSelectedTextColor = 0xffffffff;
    (this->m_colors).pinSameNetColor = 0xff888888;
    (this->m_colors).pinSameNetFillColor = 0xffff9999;
    (this->m_colors).pinSameNetTextColor = 0xff111111;
    (this->m_colors).pinHaloColor = 0x8822ff22;
    (this->m_colors).pinNetWebColor = 0xaa0000ff;
    (this->m_colors).pinNetWebOSColor = 0x33ff0000;
    (this->m_colors).annotationPartAliasColor = 0xff00ffff;
    (this->m_colors).annotationBoxColor = 0xaa0000ff;
    (this->m_colors).annotationStalkColor = 0xff000000;
    (this->m_colors).annotationPopupBackgroundColor = 0xffeeeeee;
    (this->m_colors).annotationPopupTextColor = 0xff000000;
    (this->m_colors).selectedMaskPins = 0xffffffff;
    (this->m_colors).selectedMaskParts = 0xffffffff;
    (this->m_colors).selectedMaskOutline = 0xffffffff;
  }
  (this->m_colors).orMaskPins = 0;
  (this->m_colors).orMaskParts = 0;
  (this->m_colors).orMaskOutline = 0;
  return;
}

Assistant:

void BoardView::ThemeSetStyle(const char *name) {
	ImGuiStyle &style = ImGui::GetStyle();

	// non color-related settings
	style.WindowBorderSize = 0.0f;

	if (strcmp(name, "dark") == 0) {
		style.Colors[ImGuiCol_Text]          = ImVec4(0.90f, 0.90f, 0.90f, 1.00f);
		style.Colors[ImGuiCol_TextDisabled]  = ImVec4(0.60f, 0.60f, 0.60f, 1.00f);
		style.Colors[ImGuiCol_WindowBg]      = ImVec4(0.00f, 0.00f, 0.00f, 0.70f);
		style.Colors[ImGuiCol_ChildBg]       = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
		style.Colors[ImGuiCol_PopupBg]       = ImVec4(0.05f, 0.05f, 0.10f, 0.90f);
		style.Colors[ImGuiCol_Border]        = ImVec4(0.70f, 0.70f, 0.70f, 0.65f);
		style.Colors[ImGuiCol_BorderShadow]  = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
		style.Colors[ImGuiCol_FrameBg] =
		    ImVec4(0.30f, 0.30f, 0.30f, 1.0f); // Background of checkbox, radio button, plot, slider, text input
		style.Colors[ImGuiCol_FrameBgHovered]       = ImVec4(0.90f, 0.80f, 0.80f, 0.40f);
		style.Colors[ImGuiCol_FrameBgActive]        = ImVec4(0.90f, 0.65f, 0.65f, 0.45f);
		style.Colors[ImGuiCol_TitleBg]              = ImVec4(0.27f, 0.27f, 0.54f, 0.83f);
		style.Colors[ImGuiCol_TitleBgCollapsed]     = ImVec4(0.40f, 0.40f, 0.80f, 0.20f);
		style.Colors[ImGuiCol_TitleBgActive]        = ImVec4(0.32f, 0.32f, 0.63f, 0.87f);
		style.Colors[ImGuiCol_MenuBarBg]            = ImVec4(0.40f, 0.40f, 0.55f, 0.80f);
		style.Colors[ImGuiCol_ScrollbarBg]          = ImVec4(0.20f, 0.25f, 0.30f, 0.60f);
		style.Colors[ImGuiCol_ScrollbarGrab]        = ImVec4(0.40f, 0.40f, 0.80f, 0.30f);
		style.Colors[ImGuiCol_ScrollbarGrabHovered] = ImVec4(0.40f, 0.40f, 0.80f, 0.40f);
		style.Colors[ImGuiCol_ScrollbarGrabActive]  = ImVec4(0.80f, 0.50f, 0.50f, 0.40f);
		style.Colors[ImGuiCol_CheckMark]            = ImVec4(0.90f, 0.90f, 0.90f, 0.50f);
		style.Colors[ImGuiCol_SliderGrab]           = ImVec4(1.00f, 1.00f, 1.00f, 0.30f);
		style.Colors[ImGuiCol_SliderGrabActive]     = ImVec4(0.80f, 0.50f, 0.50f, 1.00f);
		style.Colors[ImGuiCol_Button]               = ImVec4(0.67f, 0.40f, 0.40f, 0.60f);
		style.Colors[ImGuiCol_ButtonHovered]        = ImVec4(0.67f, 0.40f, 0.40f, 1.00f);
		style.Colors[ImGuiCol_ButtonActive]         = ImVec4(0.80f, 0.50f, 0.50f, 1.00f);
		style.Colors[ImGuiCol_Header]               = ImVec4(0.40f, 0.40f, 0.90f, 0.45f);
		style.Colors[ImGuiCol_HeaderHovered]        = ImVec4(0.45f, 0.45f, 0.90f, 0.80f);
		style.Colors[ImGuiCol_HeaderActive]         = ImVec4(0.53f, 0.53f, 0.87f, 0.80f);
		style.Colors[ImGuiCol_Separator]            = ImVec4(0.50f, 0.50f, 0.50f, 1.00f);
		style.Colors[ImGuiCol_SeparatorHovered]     = ImVec4(0.70f, 0.60f, 0.60f, 1.00f);
		style.Colors[ImGuiCol_SeparatorActive]      = ImVec4(0.90f, 0.70f, 0.70f, 1.00f);
		style.Colors[ImGuiCol_ResizeGrip]           = ImVec4(1.00f, 1.00f, 1.00f, 0.30f);
		style.Colors[ImGuiCol_ResizeGripHovered]    = ImVec4(1.00f, 1.00f, 1.00f, 0.60f);
		style.Colors[ImGuiCol_ResizeGripActive]     = ImVec4(1.00f, 1.00f, 1.00f, 0.90f);
		style.Colors[ImGuiCol_PlotLines]            = ImVec4(1.00f, 1.00f, 1.00f, 1.00f);
		style.Colors[ImGuiCol_PlotLinesHovered]     = ImVec4(0.90f, 0.70f, 0.00f, 1.00f);
		style.Colors[ImGuiCol_PlotHistogram]        = ImVec4(0.90f, 0.70f, 0.00f, 1.00f);
		style.Colors[ImGuiCol_PlotHistogramHovered] = ImVec4(1.00f, 0.60f, 0.00f, 1.00f);
		style.Colors[ImGuiCol_TextSelectedBg]       = ImVec4(0.00f, 0.00f, 1.00f, 0.35f);
		style.Colors[ImGuiCol_ModalWindowDarkening] = ImVec4(0.20f, 0.20f, 0.20f, 0.35f);
		style.Colors[ImGuiCol_TableRowBg]           = ImVec4(0.05f, 0.05f, 0.10f, 0.90f);
		style.Colors[ImGuiCol_TableRowBgAlt]        = ImVec4(0.10f, 0.10f, 0.20f, 0.90f);

		m_colors.backgroundColor          = byte4swap(0x000000ff);
		m_colors.boardFillColor           = byte4swap(0x2a2a2aff);
		m_colors.boardOutlineColor        = byte4swap(0xcc2222ff);
		m_colors.partHullColor            = byte4swap(0x80808080);
		m_colors.partOutlineColor         = byte4swap(0x999999ff);
		m_colors.partFillColor            = byte4swap(0x111111ff);
		m_colors.partHighlightedColor     = byte4swap(0xffffffff);
		m_colors.partHighlightedFillColor = byte4swap(0x333333ff);
		m_colors.partTextColor            = byte4swap(0x000000ff);
		m_colors.partTextBackgroundColor  = byte4swap(0xcccc22ff);
		m_colors.pinDefaultColor          = byte4swap(0x4040ffff);
		m_colors.pinDefaultTextColor      = byte4swap(0xccccccff);
		m_colors.pinGroundColor           = byte4swap(0x0300C3ff);
		m_colors.pinNotConnectedColor     = byte4swap(0xaaaaaaff);
		m_colors.pinTestPadColor          = byte4swap(0x888888ff);
		m_colors.pinTestPadFillColor      = byte4swap(0x6c5b1fff);
		m_colors.pinA1PadColor            = byte4swap(0xdd0000ff);

		m_colors.pinSelectedColor     = byte4swap(0x00ff00ff);
		m_colors.pinSelectedFillColor = byte4swap(0x8888ffff);
		m_colors.pinSelectedTextColor = byte4swap(0xffffffff);

		m_colors.pinSameNetColor     = byte4swap(0x0000ffff);
		m_colors.pinSameNetFillColor = byte4swap(0x9999ffff);
		m_colors.pinSameNetTextColor = byte4swap(0x111111ff);

		m_colors.pinHaloColor     = byte4swap(0xffffff88);
		m_colors.pinNetWebColor   = byte4swap(0xff888888);
		m_colors.pinNetWebOSColor = byte4swap(0x8888ff88);

		m_colors.annotationPartAliasColor       = byte4swap(0xffff00ff);
		m_colors.annotationBoxColor             = byte4swap(0xcccc88ff);
		m_colors.annotationStalkColor           = byte4swap(0xaaaaaaff);
		m_colors.annotationPopupBackgroundColor = byte4swap(0x888888ff);
		m_colors.annotationPopupTextColor       = byte4swap(0xffffffff);

		m_colors.selectedMaskPins    = byte4swap(0xffffffff);
		m_colors.selectedMaskParts   = byte4swap(0xffffffff);
		m_colors.selectedMaskOutline = byte4swap(0xffffffff);

		m_colors.orMaskPins    = byte4swap(0x0);
		m_colors.orMaskParts   = byte4swap(0x0);
		m_colors.orMaskOutline = byte4swap(0x0);

	} else {
		// light theme default
		style.Colors[ImGuiCol_Text]                 = ImVec4(0.00f, 0.00f, 0.00f, 1.00f);
		style.Colors[ImGuiCol_TextDisabled]         = ImVec4(0.60f, 0.60f, 0.60f, 1.00f);
		style.Colors[ImGuiCol_PopupBg]              = ImVec4(0.94f, 0.94f, 0.94f, 1.00f);
		style.Colors[ImGuiCol_WindowBg]             = ImVec4(0.94f, 0.94f, 0.94f, 1.00f);
		style.Colors[ImGuiCol_ChildBg]              = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
		style.Colors[ImGuiCol_Border]               = ImVec4(0.00f, 0.00f, 0.00f, 0.39f);
		style.Colors[ImGuiCol_BorderShadow]         = ImVec4(1.00f, 1.00f, 1.00f, 0.10f);
		style.Colors[ImGuiCol_FrameBg]              = ImVec4(1.00f, 1.00f, 1.00f, 1.00f);
		style.Colors[ImGuiCol_FrameBgHovered]       = ImVec4(0.26f, 0.59f, 0.98f, 0.40f);
		style.Colors[ImGuiCol_FrameBgActive]        = ImVec4(0.26f, 0.59f, 0.98f, 0.67f);
		style.Colors[ImGuiCol_TitleBg]              = ImVec4(0.96f, 0.96f, 0.96f, 1.00f);
		style.Colors[ImGuiCol_TitleBgCollapsed]     = ImVec4(1.00f, 1.00f, 1.00f, 0.51f);
		style.Colors[ImGuiCol_TitleBgActive]        = ImVec4(0.82f, 0.82f, 0.82f, 1.00f);
		style.Colors[ImGuiCol_MenuBarBg]            = ImVec4(0.82f, 0.82f, 0.82f, 1.00f);
		style.Colors[ImGuiCol_ScrollbarBg]          = ImVec4(0.98f, 0.98f, 0.98f, 0.53f);
		style.Colors[ImGuiCol_ScrollbarGrab]        = ImVec4(0.69f, 0.69f, 0.69f, 0.80f);
		style.Colors[ImGuiCol_ScrollbarGrabHovered] = ImVec4(0.49f, 0.49f, 0.49f, 0.80f);
		style.Colors[ImGuiCol_ScrollbarGrabActive]  = ImVec4(0.49f, 0.49f, 0.49f, 1.00f);
		style.Colors[ImGuiCol_CheckMark]            = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
		style.Colors[ImGuiCol_SliderGrab]           = ImVec4(0.26f, 0.59f, 0.98f, 0.78f);
		style.Colors[ImGuiCol_SliderGrabActive]     = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
		style.Colors[ImGuiCol_Button]               = ImVec4(0.26f, 0.59f, 0.98f, 0.40f);
		style.Colors[ImGuiCol_ButtonHovered]        = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
		style.Colors[ImGuiCol_ButtonActive]         = ImVec4(0.06f, 0.53f, 0.98f, 1.00f);
		style.Colors[ImGuiCol_Header]               = ImVec4(0.26f, 0.59f, 0.98f, 0.31f);
		style.Colors[ImGuiCol_HeaderHovered]        = ImVec4(0.26f, 0.59f, 0.98f, 0.80f);
		style.Colors[ImGuiCol_HeaderActive]         = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
		style.Colors[ImGuiCol_Separator]            = ImVec4(0.39f, 0.39f, 0.39f, 1.00f);
		style.Colors[ImGuiCol_SeparatorHovered]     = ImVec4(0.26f, 0.59f, 0.98f, 0.78f);
		style.Colors[ImGuiCol_SeparatorActive]      = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
		style.Colors[ImGuiCol_ResizeGrip]           = ImVec4(1.00f, 1.00f, 1.00f, 0.00f);
		style.Colors[ImGuiCol_ResizeGripHovered]    = ImVec4(0.26f, 0.59f, 0.98f, 0.67f);
		style.Colors[ImGuiCol_ResizeGripActive]     = ImVec4(0.26f, 0.59f, 0.98f, 0.95f);
		style.Colors[ImGuiCol_PlotLines]            = ImVec4(0.39f, 0.39f, 0.39f, 1.00f);
		style.Colors[ImGuiCol_PlotLinesHovered]     = ImVec4(1.00f, 0.43f, 0.35f, 1.00f);
		style.Colors[ImGuiCol_PlotHistogram]        = ImVec4(0.90f, 0.70f, 0.00f, 1.00f);
		style.Colors[ImGuiCol_PlotHistogramHovered] = ImVec4(1.00f, 0.60f, 0.00f, 1.00f);
		style.Colors[ImGuiCol_TextSelectedBg]       = ImVec4(0.26f, 0.59f, 0.98f, 0.35f);
		style.Colors[ImGuiCol_ModalWindowDarkening] = ImVec4(0.20f, 0.20f, 0.20f, 0.35f);
		style.Colors[ImGuiCol_TableRowBg]           = ImVec4(0.94f, 0.94f, 0.94f, 1.00f);
		style.Colors[ImGuiCol_TableRowBgAlt]        = ImVec4(0.82f, 0.82f, 0.82f, 1.00f);

		m_colors.backgroundColor          = byte4swap(0xffffffff);
		m_colors.boardFillColor           = byte4swap(0xddddddff);
		m_colors.partHullColor            = byte4swap(0x80808080);
		m_colors.partOutlineColor         = byte4swap(0x444444ff);
		m_colors.partFillColor            = byte4swap(0xffffff77);
		m_colors.partHighlightedColor     = byte4swap(0xff0000ff);
		m_colors.partHighlightedFillColor = byte4swap(0xf0f0f0ff);
		m_colors.partTextColor            = byte4swap(0xff3030ff);
		m_colors.partTextBackgroundColor  = byte4swap(0xffff00ff);
		m_colors.boardOutlineColor        = byte4swap(0x444444ff);
		m_colors.pinDefaultColor          = byte4swap(0x22aa33ff);
		m_colors.pinDefaultTextColor      = byte4swap(0x666688ff);
		m_colors.pinGroundColor           = byte4swap(0x2222aaff);
		m_colors.pinNotConnectedColor     = byte4swap(0xaaaaaaff);
		m_colors.pinTestPadColor          = byte4swap(0x888888ff);
		m_colors.pinTestPadFillColor      = byte4swap(0xd6c68dff);
		m_colors.pinA1PadColor            = byte4swap(0xdd0000ff);

		m_colors.pinSelectedColor     = byte4swap(0x00000000);
		m_colors.pinSelectedFillColor = byte4swap(0x8888ffff);
		m_colors.pinSelectedTextColor = byte4swap(0xffffffff);

		m_colors.pinSameNetColor     = byte4swap(0x888888ff);
		m_colors.pinSameNetFillColor = byte4swap(0x9999ffff);
		m_colors.pinSameNetTextColor = byte4swap(0x111111ff);

		m_colors.pinHaloColor     = byte4swap(0x22FF2288);
		m_colors.pinNetWebColor   = byte4swap(0xff0000aa);
		m_colors.pinNetWebOSColor = byte4swap(0x0000ff33);

		m_colors.annotationPartAliasColor       = byte4swap(0xffff00ff);
		m_colors.annotationBoxColor             = byte4swap(0xff0000aa);
		m_colors.annotationStalkColor           = byte4swap(0x000000ff);
		m_colors.annotationPopupBackgroundColor = byte4swap(0xeeeeeeff);
		m_colors.annotationPopupTextColor       = byte4swap(0x000000ff);

		m_colors.selectedMaskPins    = byte4swap(0xffffffff);
		m_colors.selectedMaskParts   = byte4swap(0xffffffff);
		m_colors.selectedMaskOutline = byte4swap(0xffffffff);

		m_colors.orMaskPins    = byte4swap(0x0);
		m_colors.orMaskParts   = byte4swap(0x0);
		m_colors.orMaskOutline = byte4swap(0x0);
	}
}